

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# files_test.c
# Opt level: O0

void make_scratch(scratch *s)

{
  nng_err nVar1;
  int iVar2;
  char *pcVar3;
  nng_err result__2;
  nng_err result__1;
  nng_err result_;
  scratch *s_local;
  
  pcVar3 = nni_plat_temp_dir();
  s->temp = pcVar3;
  acutest_check_((uint)(s->temp != (char *)0x0),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/files_test.c"
                 ,0x9b,"%s","s->temp != NULL");
  pcVar3 = nni_file_join(s->temp,"nng_files_test");
  s->mydir = pcVar3;
  acutest_check_((uint)(s->mydir != (char *)0x0),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/files_test.c"
                 ,0x9d,"%s","s->mydir != NULL");
  pcVar3 = nni_file_join(s->mydir,"a");
  s->a = pcVar3;
  acutest_check_((uint)(s->a != (char *)0x0),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/files_test.c"
                 ,0x9f,"%s","s->a != NULL");
  pcVar3 = nni_file_join(s->mydir,"b");
  s->b = pcVar3;
  acutest_check_((uint)(s->b != (char *)0x0),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/files_test.c"
                 ,0xa1,"%s","s->b != NULL");
  pcVar3 = nni_file_join(s->mydir,"c");
  s->c = pcVar3;
  acutest_check_((uint)(s->c != (char *)0x0),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/files_test.c"
                 ,0xa3,"%s","s->c != NULL");
  pcVar3 = nni_file_join(s->c,"d");
  s->d = pcVar3;
  acutest_check_((uint)(s->d != (char *)0x0),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/files_test.c"
                 ,0xa5,"%s","s->d != NULL");
  nVar1 = nni_file_put(s->a,"alpha",6);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/files_test.c"
                         ,0xa7,"%s: expected success, got %s (%d)",
                         "nni_file_put(s->a, \"alpha\", 6)",pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nni_file_put(s->b,"bravo",6);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/files_test.c"
                         ,0xa8,"%s: expected success, got %s (%d)",
                         "nni_file_put(s->b, \"bravo\", 6)",pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nni_file_put(s->d,"delta",6);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/files_test.c"
                         ,0xa9,"%s: expected success, got %s (%d)",
                         "nni_file_put(s->d, \"delta\", 6)",pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  return;
}

Assistant:

static void
make_scratch(struct scratch *s)
{
	s->temp = nni_plat_temp_dir();
	NUTS_TRUE(s->temp != NULL);
	s->mydir = nni_file_join(s->temp, "nng_files_test");
	NUTS_TRUE(s->mydir != NULL);
	s->a = nni_file_join(s->mydir, "a");
	NUTS_TRUE(s->a != NULL);
	s->b = nni_file_join(s->mydir, "b");
	NUTS_TRUE(s->b != NULL);
	s->c = nni_file_join(s->mydir, "c");
	NUTS_TRUE(s->c != NULL);
	s->d = nni_file_join(s->c, "d");
	NUTS_TRUE(s->d != NULL);

	NUTS_PASS(nni_file_put(s->a, "alpha", 6));
	NUTS_PASS(nni_file_put(s->b, "bravo", 6));
	NUTS_PASS(nni_file_put(s->d, "delta", 6));
}